

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_006fc200;
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::RepeatedPtrField(&this->itemitemsimilarities_,arena);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  itemitemsimilarities_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.ItemSimilarityRecommender)
}